

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void duckdb::ZSTDStorage::Compress(CompressionState *state_p,Vector *input,idx_t count)

{
  idx_t iVar1;
  idx_t i;
  idx_t iVar2;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(input,count,&local_68);
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    iVar1 = iVar2;
    if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
      iVar1 = (idx_t)(local_68.sel)->sel_vector[iVar2];
    }
    if (((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar1 >> 6] >>
          (iVar1 & 0x3f) & 1) != 0)) && (*(int *)(local_68.data + iVar1 * 0x10) != 0)) {
      ZSTDCompressionState::AddString
                ((ZSTDCompressionState *)state_p,(string_t *)(local_68.data + iVar1 * 0x10));
    }
    else {
      ZSTDCompressionState::AddNull((ZSTDCompressionState *)state_p);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
  return;
}

Assistant:

void ZSTDStorage::Compress(CompressionState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<ZSTDCompressionState>();

	// Get vector data
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		// Note: we treat nulls and empty strings the same
		if (!vdata.validity.RowIsValid(idx) || data[idx].GetSize() == 0) {
			state.AddNull();
			continue;
		}
		state.AddString(data[idx]);
	}
}